

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptNativeFloatArray::DirectGetVarItemAt
          (JavascriptNativeFloatArray *this,uint32 index,Var *value,ScriptContext *requestContext)

{
  bool bVar1;
  BOOL BVar2;
  undefined1 *puVar3;
  double local_30;
  double dvalue;
  int32 ivalue;
  
  BVar2 = JavascriptArray::DirectGetItemAt<double>((JavascriptArray *)this,index,&local_30);
  if (BVar2 == 0) {
    BVar2 = 0;
  }
  else {
    puVar3 = &DAT_1000000000000;
    if (local_30 != 0.0) {
      bVar1 = JavascriptNumber::TryGetInt32Value<false>(local_30,(int32 *)((long)&dvalue + 4));
      if (bVar1) {
        puVar3 = (undefined1 *)((ulong)dvalue._4_4_ | 0x1000000000000);
      }
      else {
        puVar3 = (undefined1 *)JavascriptNumber::ToVarWithCheck(local_30,requestContext);
      }
    }
    *value = puVar3;
    BVar2 = 1;
  }
  return BVar2;
}

Assistant:

BOOL JavascriptNativeFloatArray::DirectGetVarItemAt(uint32 index, Var *value, ScriptContext *requestContext)
    {
        double dvalue;
        int32 ivalue;
        if (!this->DirectGetItemAt<double>(index, &dvalue))
        {
            return FALSE;
        }
        if (*(uint64*)&dvalue == 0ull)
        {
            *value = TaggedInt::ToVarUnchecked(0);
        }
        else if (JavascriptNumber::TryGetInt32Value(dvalue, &ivalue) && !TaggedInt::IsOverflow(ivalue))
        {
            *value = TaggedInt::ToVarUnchecked(ivalue);
        }
        else
        {
            *value = JavascriptNumber::ToVarWithCheck(dvalue, requestContext);
        }
        return TRUE;
    }